

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O3

void __thiscall
duckdb::PrimitiveColumnWriter::BeginWrite(PrimitiveColumnWriter *this,ColumnWriterState *state_p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _Bit_type *p_Var3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  tuple<duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_> tVar7;
  reference pvVar8;
  Allocator *allocator_p;
  uint64_t capacity;
  tuple<duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_> this_00;
  size_type __n;
  undefined1 auVar9 [16];
  _Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false> local_268;
  pointer *local_260;
  pointer *local_258;
  undefined1 local_250 [464];
  undefined1 local_80 [8];
  tuple<duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
  tStack_78;
  idx_t local_70;
  idx_t iStack_68;
  idx_t local_60;
  undefined1 local_58 [16];
  AllocatedData local_48;
  
  (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xb])(local_250,this);
  uVar6 = local_250._0_8_;
  local_250._0_8_ = (long *)0x0;
  p_Var3 = state_p[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p;
  state_p[1].is_empty.super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)uVar6;
  if ((p_Var3 != (_Bit_type *)0x0) &&
     ((**(code **)(*p_Var3 + 8))(), (long *)local_250._0_8_ != (long *)0x0)) {
    (**(code **)(*(long *)local_250._0_8_ + 8))();
  }
  if (state_p[1].repetition_levels.super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      state_p[1].definition_levels.super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_260 = &state_p[1].definition_levels.
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    local_258 = &state_p[1].repetition_levels.
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    __n = 0;
    do {
      pvVar8 = vector<duckdb::PageInformation,_true>::operator[]
                         ((vector<duckdb::PageInformation,_true> *)local_260,__n);
      if (pvVar8->row_count == 0) {
        vector<duckdb::PageInformation,_true>::erase_at
                  ((vector<duckdb::PageInformation,_true> *)local_260,__n);
        break;
      }
      duckdb_parquet::PageHeader::PageHeader((PageHeader *)local_250);
      local_70 = 0;
      iStack_68 = 0;
      _local_80 = (undefined1  [16])0x0;
      local_60 = 0;
      AllocatedData::AllocatedData(&local_48);
      local_250._16_4_ = 0;
      local_250._8_4_ = DATA_PAGE;
      local_250._12_4_ = 0;
      local_250[0x1c8] = (_PageHeader__isset)((byte)local_250[0x1c8] | 2);
      local_250._32_4_ = (undefined4)pvVar8->row_count;
      local_250._36_4_ = (*(this->super_ColumnWriter)._vptr_ColumnWriter[10])(this,state_p);
      local_250._40_4_ = RLE;
      local_250._44_4_ = RLE;
      allocator_p = Allocator::Get(((this->super_ColumnWriter).writer)->context);
      capacity = NextPowerOfTwo(pvVar8->estimated_page_size);
      this_00.
      super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
      super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>)
           operator_new(0x30);
      if (capacity < 0x201) {
        capacity = 0x200;
      }
      MemoryStream::MemoryStream
                ((MemoryStream *)
                 this_00.
                 super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>
                 .super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl,allocator_p,
                 capacity);
      if ((__uniq_ptr_data<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>,_true,_true>
           )local_80 !=
          (tuple<duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>)0x0) {
        lVar4 = *(long *)local_80;
        local_80 = (undefined1  [8])
                   this_00.
                   super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>
                   .super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
        (**(code **)(lVar4 + 0x10))();
        this_00.
        super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
        super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>)
             (_Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>)
             local_80;
      }
      local_80 = (undefined1  [8])
                 this_00.
                 super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>
                 .super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
      uVar1 = pvVar8->row_count;
      uVar2 = pvVar8->empty_count;
      auVar9._8_4_ = (int)uVar1;
      auVar9._0_8_ = uVar2;
      auVar9._12_4_ = (int)((ulong)uVar1 >> 0x20);
      local_60 = auVar9._8_8_;
      iStack_68 = uVar2;
      (*(this->super_ColumnWriter)._vptr_ColumnWriter[0xc])(&local_268,this,state_p,__n);
      tVar7.
      super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
      .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )(_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
              )tStack_78;
      tStack_78.
      super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
      .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )(_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
              )local_268._M_head_impl;
      local_268._M_head_impl = (ColumnWriterPageState *)0x0;
      if ((tVar7.
           super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
           .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl !=
           (_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )0x0) &&
         ((**(code **)(*(long *)tVar7.
                                super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
                                .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>.
                                _M_head_impl + 8))(),
         local_268._M_head_impl != (ColumnWriterPageState *)0x0)) {
        (*(local_268._M_head_impl)->_vptr_ColumnWriterPageState[1])();
      }
      local_58 = (undefined1  [16])0x0;
      ::std::vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>::
      emplace_back<duckdb::PageWriteInformation>
                ((vector<duckdb::PageWriteInformation,_std::allocator<duckdb::PageWriteInformation>_>
                  *)local_258,(PageWriteInformation *)local_250);
      AllocatedData::~AllocatedData(&local_48);
      if (tStack_78.
          super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
          .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
           )0x0) {
        (*(*(_func_int ***)
            tStack_78.
            super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
            .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl)[1])();
      }
      tStack_78.
      super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
      .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )(_Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>)0x0;
      auVar9 = _local_80;
      tStack_78.
      super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
      .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )(_Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>)0x0;
      if ((__uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)
          local_80 !=
          (__uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>)0x0) {
        _local_80 = auVar9;
        (**(code **)(*(long *)local_80 + 0x10))();
      }
      auVar5._8_8_ = 0;
      auVar5._0_8_ = tStack_78.
                     super__Tuple_impl<0UL,_duckdb::ColumnWriterPageState_*,_std::default_delete<duckdb::ColumnWriterPageState>_>
                     .super__Head_base<0UL,_duckdb::ColumnWriterPageState_*,_false>._M_head_impl;
      _local_80 = auVar5 << 0x40;
      duckdb_parquet::PageHeader::~PageHeader((PageHeader *)local_250);
      __n = __n + 1;
    } while (__n < (ulong)(((long)state_p[1].repetition_levels.
                                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start -
                            (long)state_p[1].definition_levels.
                                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage >> 3) *
                          -0x3333333333333333));
  }
  NextPage(this,(PrimitiveColumnWriterState *)state_p);
  return;
}

Assistant:

void PrimitiveColumnWriter::BeginWrite(ColumnWriterState &state_p) {
	auto &state = state_p.Cast<PrimitiveColumnWriterState>();

	// set up the page write info
	state.stats_state = InitializeStatsState();
	for (idx_t page_idx = 0; page_idx < state.page_info.size(); page_idx++) {
		auto &page_info = state.page_info[page_idx];
		if (page_info.row_count == 0) {
			D_ASSERT(page_idx + 1 == state.page_info.size());
			state.page_info.erase_at(page_idx);
			break;
		}
		PageWriteInformation write_info;
		// set up the header
		auto &hdr = write_info.page_header;
		hdr.compressed_page_size = 0;
		hdr.uncompressed_page_size = 0;
		hdr.type = PageType::DATA_PAGE;
		hdr.__isset.data_page_header = true;

		hdr.data_page_header.num_values = UnsafeNumericCast<int32_t>(page_info.row_count);
		hdr.data_page_header.encoding = GetEncoding(state);
		hdr.data_page_header.definition_level_encoding = Encoding::RLE;
		hdr.data_page_header.repetition_level_encoding = Encoding::RLE;

		write_info.temp_writer = make_uniq<MemoryStream>(
		    Allocator::Get(writer.GetContext()),
		    MaxValue<idx_t>(NextPowerOfTwo(page_info.estimated_page_size), MemoryStream::DEFAULT_INITIAL_CAPACITY));
		write_info.write_count = page_info.empty_count;
		write_info.max_write_count = page_info.row_count;
		write_info.page_state = InitializePageState(state, page_idx);

		write_info.compressed_size = 0;
		write_info.compressed_data = nullptr;

		state.write_info.push_back(std::move(write_info));
	}

	// start writing the first page
	NextPage(state);
}